

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalysis.cpp
# Opt level: O3

void __thiscall
luna::SemanticAnalysisVisitor::Visit(SemanticAnalysisVisitor *this,VarList *var_list,void *data)

{
  pointer puVar1;
  SyntaxTree *pSVar2;
  pointer puVar3;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *var;
  pointer puVar4;
  ExpVarData exp_var_data;
  undefined8 local_3c;
  undefined1 local_34;
  
  local_3c = 2;
  local_34 = 0;
  puVar3 = (var_list->var_list_).
           super__Vector_base<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (var_list->var_list_).
           super__Vector_base<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar4 = puVar3;
  if (puVar3 != puVar1) {
    do {
      pSVar2 = (puVar3->_M_t).
               super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
               super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
               super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
      (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,this,&local_3c);
      puVar3 = puVar3 + 1;
    } while (puVar3 != puVar1);
    puVar3 = (var_list->var_list_).
             super__Vector_base<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    puVar4 = (var_list->var_list_).
             super__Vector_base<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  *(long *)data = (long)puVar3 - (long)puVar4 >> 3;
  return;
}

Assistant:

void SemanticAnalysisVisitor::Visit(VarList *var_list, void *data)
    {
        ExpVarData exp_var_data{ SemanticOp_Write };
        for (auto &var : var_list->var_list_)
            var->Accept(this, &exp_var_data);
        static_cast<VarListData *>(data)->var_count_ = var_list->var_list_.size();
    }